

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncQueue.h
# Opt level: O0

void __thiscall
nrg::detail::AsyncQueue<nrg::PrioExecution>::AsyncQueue
          (AsyncQueue<nrg::PrioExecution> *this,ExceptionHandler *onError)

{
  AsyncQueue<nrg::PrioExecution> *local_40;
  code *local_38;
  undefined8 local_30;
  ExceptionHandler *local_18;
  ExceptionHandler *onError_local;
  AsyncQueue<nrg::PrioExecution> *this_local;
  
  local_18 = onError;
  onError_local = (ExceptionHandler *)this;
  std::mutex::mutex(&this->guard_);
  std::condition_variable::condition_variable(&this->cond_);
  std::
  priority_queue<nrg::PrioExecution::QueueElement,std::vector<nrg::PrioExecution::QueueElement,std::allocator<nrg::PrioExecution::QueueElement>>,std::greater<nrg::PrioExecution::QueueElement>>
  ::
  priority_queue<std::vector<nrg::PrioExecution::QueueElement,std::allocator<nrg::PrioExecution::QueueElement>>,void>
            ((priority_queue<nrg::PrioExecution::QueueElement,std::vector<nrg::PrioExecution::QueueElement,std::allocator<nrg::PrioExecution::QueueElement>>,std::greater<nrg::PrioExecution::QueueElement>>
              *)&this->queue_);
  this->running_ = true;
  std::function<void_(const_std::exception_&)>::function(&this->onError_,onError);
  local_38 = run;
  local_30 = 0;
  local_40 = this;
  std::thread::
  thread<void(nrg::detail::AsyncQueue<nrg::PrioExecution>::*)(),nrg::detail::AsyncQueue<nrg::PrioExecution>*,void>
            (&this->thread_,(type *)&local_38,&local_40);
  return;
}

Assistant:

AsyncQueue(typename AsyncStyle::ExceptionHandler onError)
        : running_(true)
        , onError_(std::move(onError))
        , thread_(std::thread(&AsyncQueue::run, this))
    {}